

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O3

LinearSpace3fa * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,range<unsigned_long> *set)

{
  uint uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [12];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  float fVar23;
  float fVar24;
  undefined1 auVar21 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  float fVar25;
  float fVar26;
  vfloat4 a;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  Vec3fa axis1;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar11 = set->_begin;
  uVar7 = set->_end;
  if (uVar11 < uVar7) {
    uVar9 = uVar11 << 5 | 0x1c;
    local_68 = 0;
    uStack_60 = 0x3f800000;
    uVar10 = 0xffffffffffffffff;
    do {
      uVar1 = *(uint *)((long)this->prims + (uVar9 - 0x10));
      uVar8 = CONCAT44(*(undefined4 *)((long)&(this->prims->lower).field_0 + uVar9),uVar1);
      if (uVar8 < uVar10) {
        (*(((this->scene->geometries).items[uVar1].ptr)->super_RefCount)._vptr_RefCount[0x37])
                  (&local_48);
        fVar16 = fStack_44 * fStack_44;
        fVar17 = fStack_40 * fStack_40;
        fVar18 = fStack_3c * fStack_3c;
        fVar12 = fVar16 + local_48 * local_48 + fVar17;
        fVar13 = fVar16 + fVar16 + fVar18;
        fVar17 = fVar16 + fVar17 + fVar17;
        fVar18 = fVar16 + fVar18 + fVar18;
        if (1e-18 < fVar12) {
          auVar14._4_4_ = fVar13;
          auVar14._0_4_ = fVar12;
          auVar14._8_4_ = fVar17;
          auVar14._12_4_ = fVar18;
          auVar15._4_4_ = fVar13;
          auVar15._0_4_ = fVar12;
          auVar15._8_4_ = fVar17;
          auVar15._12_4_ = fVar18;
          auVar15 = rsqrtss(auVar14,auVar15);
          fVar13 = auVar15._0_4_;
          fVar12 = fVar13 * fVar13 * fVar12 * -0.5 * fVar13 + fVar13 * 1.5;
          local_68 = CONCAT44(fStack_44 * fVar12,local_48 * fVar12);
          uStack_60 = CONCAT44(fStack_3c * fVar12,fStack_40 * fVar12);
          uVar10 = uVar8;
        }
        uVar7 = set->_end;
      }
      uVar11 = uVar11 + 1;
      uVar9 = uVar9 + 0x20;
    } while (uVar11 < uVar7);
  }
  else {
    local_68 = 0;
    uStack_60 = 0x3f800000;
  }
  fVar12 = -local_68._4_4_;
  fVar13 = -(float)uStack_60;
  auVar19._8_4_ = 0xffffffff;
  auVar19._0_8_ = 0xffffffffffffffff;
  if (fVar12 * fVar12 + (float)uStack_60 * (float)uStack_60 + 0.0 <=
      (float)local_68 * (float)local_68 + fVar13 * fVar13 + 0.0) {
    auVar19 = SUB1612((undefined1  [16])0x0,0);
  }
  auVar20._0_4_ = ~auVar19._0_4_ & (uint)fVar13;
  auVar20._4_4_ = 0;
  auVar20._8_4_ = ~auVar19._8_4_ & (uint)(float)local_68;
  auVar6._4_4_ = (uint)fVar12 & auVar19._8_4_;
  auVar6._0_4_ = (uint)(float)uStack_60 & auVar19._4_4_;
  auVar6._8_4_ = 0;
  auVar20 = auVar20 | auVar6 << 0x20;
  fVar13 = auVar20._0_4_;
  fVar17 = auVar20._4_4_;
  fVar16 = auVar20._8_4_;
  fVar12 = fVar17 * fVar17;
  fVar18 = fVar16 * fVar16;
  fVar25 = fVar12 + fVar13 * fVar13 + fVar18;
  fVar26 = fVar12 + fVar12 + 0.0;
  fVar18 = fVar12 + fVar18 + fVar18;
  fVar12 = fVar12 + 0.0 + 0.0;
  auVar27._4_4_ = fVar26;
  auVar27._0_4_ = fVar25;
  auVar27._8_4_ = fVar18;
  auVar27._12_4_ = fVar12;
  auVar4._4_4_ = fVar26;
  auVar4._0_4_ = fVar25;
  auVar4._8_4_ = fVar18;
  auVar4._12_4_ = fVar12;
  auVar15 = rsqrtss(auVar27,auVar4);
  fVar12 = auVar15._0_4_;
  fVar12 = fVar12 * 1.5 - fVar12 * fVar12 * fVar25 * 0.5 * fVar12;
  fVar13 = fVar12 * fVar13;
  fVar17 = fVar12 * fVar17;
  fVar16 = fVar12 * fVar16;
  fVar18 = fVar17 * (float)local_68 - local_68._4_4_ * fVar13;
  fVar25 = fVar16 * local_68._4_4_ - (float)uStack_60 * fVar17;
  fVar26 = fVar13 * (float)uStack_60 - (float)local_68 * fVar16;
  fVar24 = fVar12 * 0.0 * uStack_60._4_4_ - uStack_60._4_4_ * fVar12 * 0.0;
  fVar12 = fVar25 * fVar25;
  fVar23 = fVar26 * fVar26;
  fVar24 = fVar24 * fVar24;
  fVar28 = fVar23 + fVar12 + fVar18 * fVar18;
  fVar29 = fVar24 + fVar12 + fVar12;
  fVar23 = fVar23 + fVar12 + fVar23;
  fVar24 = fVar24 + fVar12 + fVar24;
  auVar21._4_4_ = fVar29;
  auVar21._0_4_ = fVar28;
  auVar21._8_4_ = fVar23;
  auVar21._12_4_ = fVar24;
  auVar5._4_4_ = fVar29;
  auVar5._0_4_ = fVar28;
  auVar5._8_4_ = fVar23;
  auVar5._12_4_ = fVar24;
  auVar15 = rsqrtss(auVar21,auVar5);
  fVar12 = auVar15._0_4_;
  fVar12 = fVar12 * 1.5 - fVar12 * fVar12 * fVar28 * 0.5 * fVar12;
  aVar22.m128[1] = fVar12 * fVar26;
  aVar22.m128[0] = fVar17;
  aVar22.m128[2] = local_68._4_4_;
  aVar22.m128[3] = 0.0;
  aVar2.m128[1] = fVar12 * fVar25;
  aVar2.m128[0] = fVar13;
  aVar2.m128[2] = (float)local_68;
  aVar2.m128[3] = 0.0;
  (__return_storage_ptr__->vx).field_0 = aVar2;
  (__return_storage_ptr__->vy).field_0 = aVar22;
  aVar3.m128[1] = fVar12 * fVar18;
  aVar3.m128[0] = fVar16;
  aVar3.m128[2] = (float)uStack_60;
  aVar3.m128[3] = 0.0;
  (__return_storage_ptr__->vz).field_0 = aVar3;
  return __return_storage_ptr__;
}

Assistant:

const LinearSpace3fa computeAlignedSpace(const range<size_t>& set)
        {
          Vec3fa axis(0,0,1);
          uint64_t bestGeomPrimID = -1;

          /*! find curve with minimum ID that defines valid direction */
          for (size_t i=set.begin(); i<set.end(); i++)
          {
            const unsigned int geomID = prims[i].geomID();
            const unsigned int primID = prims[i].primID();
            const uint64_t geomprimID = prims[i].ID64();
            if (geomprimID >= bestGeomPrimID) continue;
            const Vec3fa axis1 = scene->get(geomID)->computeDirection(primID);
            if (sqr_length(axis1) > 1E-18f) {
              axis = normalize(axis1);
              bestGeomPrimID = geomprimID;
            }
          }
          return frame(axis).transposed();
        }